

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall
kj::(anonymous_namespace)::expectResImpl<kj::Array<char16_t>,char16_t>
          (_anonymous_namespace_ *this,EncodingResult<kj::Array<char16_t>_> *result,
          ArrayPtr<const_char16_t> expected,bool errors)

{
  bool bVar1;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> end;
  unsigned_long *puVar2;
  char16_t *pcVar3;
  CappedArray<char,_5UL> CVar4;
  size_t local_148;
  char local_140 [4];
  char cStack_13c;
  CappedArray<char,_5UL> local_138;
  CappedArray<char,_5UL> local_128;
  CappedArray<char,_5UL> local_118;
  bool local_101;
  DebugExpression<char16_t_&> DStack_100;
  bool _kj_shouldLog_3;
  undefined1 local_f8 [8];
  DebugComparison<char16_t_&,_const_char16_t_&> _kjCondition_3;
  unsigned_long i;
  Iterator __end0;
  Iterator __begin0;
  size_t local_b0;
  Range<unsigned_long> local_a8;
  Range<unsigned_long> *local_98;
  Range<unsigned_long> *__range2;
  size_t local_88;
  bool local_79;
  size_t sStack_78;
  bool _kj_shouldLog_2;
  size_t local_70;
  DebugExpression<unsigned_long> local_68;
  undefined1 local_60 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_2;
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  DebugExpression<const_bool_&> DStack_30;
  bool _kj_shouldLog;
  DebugExpression<const_bool_&> _kjCondition;
  bool errors_local;
  EncodingResult<kj::Array<char16_t>_> *result_local;
  ArrayPtr<const_char16_t> expected_local;
  
  expected_local.ptr = expected.ptr;
  result_local = result;
  if (((undefined1  [16])expected & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    _kjCondition_2._37_1_ = ((byte)this[0x18] ^ 0xff) & 1;
    _kjCondition_2._38_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x25)
    ;
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)&_kjCondition_2.field_0x26);
    if (!bVar1) {
      _kjCondition_2._36_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_2._36_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x31,ERROR,"\"failed: expected \" \"!result.hadErrors\", _kjCondition",
                   (char (*) [35])"failed: expected !result.hadErrors",
                   (DebugExpression<bool> *)&_kjCondition_2.field_0x26);
        _kjCondition_2._36_1_ = 0;
      }
    }
  }
  else {
    DStack_30 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)(this + 0x18));
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)&stack0xffffffffffffffd0);
    if (!bVar1) {
      _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_2._39_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x2f,ERROR,"\"failed: expected \" \"result.hadErrors\", _kjCondition",
                   (char (*) [34])"failed: expected result.hadErrors",&stack0xffffffffffffffd0);
        _kjCondition_2._39_1_ = 0;
      }
    }
  }
  local_70 = Array<char16_t>::size((Array<char16_t> *)this);
  local_68 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_70);
  sStack_78 = ArrayPtr<const_char16_t>::size((ArrayPtr<const_char16_t> *)&result_local);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_60,&local_68,
             &stack0xffffffffffffff88);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar1) {
    local_79 = kj::_::Debug::shouldLog(ERROR);
    while (local_79 != false) {
      local_88 = Array<char16_t>::size((Array<char16_t> *)this);
      __range2 = (Range<unsigned_long> *)
                 ArrayPtr<const_char16_t>::size((ArrayPtr<const_char16_t> *)&result_local);
      kj::_::Debug::
      log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x34,ERROR,
                 "\"failed: expected \" \"result.size() == expected.size()\", _kjCondition, result.size(), expected.size()"
                 ,(char (*) [50])"failed: expected result.size() == expected.size()",
                 (DebugComparison<unsigned_long,_unsigned_long> *)local_60,&local_88,
                 (unsigned_long *)&__range2);
      local_79 = false;
    }
  }
  local_b0 = Array<char16_t>::size((Array<char16_t> *)this);
  __begin0.value = ArrayPtr<const_char16_t>::size((ArrayPtr<const_char16_t> *)&result_local);
  end = min<unsigned_long,unsigned_long>(&local_b0,&__begin0.value);
  local_a8 = zeroTo<unsigned_long>(end);
  local_98 = &local_a8;
  __end0 = Range<unsigned_long>::begin(local_98);
  i = (unsigned_long)Range<unsigned_long>::end(local_98);
  while (bVar1 = Range<unsigned_long>::Iterator::operator==(&__end0,(Iterator *)&i),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    puVar2 = Range<unsigned_long>::Iterator::operator*(&__end0);
    _kjCondition_3._32_8_ = *puVar2;
    pcVar3 = Array<char16_t>::operator[]((Array<char16_t> *)this,_kjCondition_3._32_8_);
    DStack_100 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pcVar3);
    pcVar3 = ArrayPtr<const_char16_t>::operator[]
                       ((ArrayPtr<const_char16_t> *)&result_local,_kjCondition_3._32_8_);
    kj::_::DebugExpression<char16_t&>::operator==
              ((DebugComparison<char16_t_&,_const_char16_t_&> *)local_f8,
               (DebugExpression<char16_t&> *)&stack0xffffffffffffff00,pcVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
    if (!bVar1) {
      local_101 = kj::_::Debug::shouldLog(ERROR);
      while (local_101 != false) {
        pcVar3 = Array<char16_t>::operator[]((Array<char16_t> *)this,_kjCondition_3._32_8_);
        local_128 = anon_unknown_0::hex(*pcVar3);
        local_118.content = local_128.content;
        local_118.currentSize._0_5_ = (undefined5)local_128.currentSize;
        local_118.currentSize._5_3_ = local_128.currentSize._5_3_;
        pcVar3 = ArrayPtr<const_char16_t>::operator[]
                           ((ArrayPtr<const_char16_t> *)&result_local,_kjCondition_3._32_8_);
        CVar4 = anon_unknown_0::hex(*pcVar3);
        local_148 = CVar4.currentSize;
        local_138.currentSize = local_148;
        local_140 = CVar4.content._0_4_;
        local_138.content[0] = local_140[0];
        local_138.content[1] = local_140[1];
        local_138.content[2] = local_140[2];
        local_138.content[3] = local_140[3];
        cStack_13c = CVar4.content[4];
        local_138.content[4] = cStack_13c;
        kj::_::Debug::
        log<char_const(&)[42],kj::_::DebugComparison<char16_t&,char16_t_const&>&,unsigned_long&,kj::CappedArray<char,5ul>,kj::CappedArray<char,5ul>>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x36,ERROR,
                   "\"failed: expected \" \"result[i] == expected[i]\", _kjCondition, i, hex(result[i]), hex(expected[i])"
                   ,(char (*) [42])"failed: expected result[i] == expected[i]",
                   (DebugComparison<char16_t_&,_const_char16_t_&> *)local_f8,
                   (unsigned_long *)&_kjCondition_3.result,&local_118,&local_138);
        local_101 = false;
      }
    }
    Range<unsigned_long>::Iterator::operator++(&__end0);
  }
  return;
}

Assistant:

void expectResImpl(EncodingResult<T> result,
                   ArrayPtr<const U> expected,
                   bool errors = false) {
  if (errors) {
    KJ_EXPECT(result.hadErrors);
  } else {
    KJ_EXPECT(!result.hadErrors);
  }

  KJ_EXPECT(result.size() == expected.size(), result.size(), expected.size());
  for (auto i: kj::zeroTo(kj::min(result.size(), expected.size()))) {
    KJ_EXPECT(result[i] == expected[i], i, hex(result[i]), hex(expected[i]));
  }
}